

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall
StyleParser::parse_paint
          (StyleParser *this,shared_ptr<PaintServer> *paint,PaintServerMap *paint_servers)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  const_iterator cVar6;
  PaintServer *__tmp;
  size_t sVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Color CVar8;
  StringView id;
  StringView local_78;
  long local_68 [2];
  key_type local_58;
  undefined8 local_48;
  undefined1 local_38 [16];
  
  bVar4 = Parser::parse(&this->super_Parser,"none");
  if (bVar4) {
    this_00 = (paint->super___shared_ptr<PaintServer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
    ;
    (paint->super___shared_ptr<PaintServer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)0x0;
    (paint->super___shared_ptr<PaintServer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    bVar4 = Parser::parse(&this->super_Parser,"inherit");
    if (bVar4) {
      return;
    }
    bVar4 = Parser::parse(&this->super_Parser,"url");
    if (bVar4) {
      local_78.s = "(";
      local_78.size = StringView::strlen((StringView *)"(",(char *)0x0);
      Parser::expect(&this->super_Parser,&local_78);
      local_78.s = "#";
      local_78.size = StringView::strlen((StringView *)"#",(char *)0x0);
      Parser::expect(&this->super_Parser,&local_78);
      local_58.s = (this->super_Parser).s.s;
      sVar7 = (this->super_Parser).s.size;
      pcVar3 = local_58.s;
      do {
        if (sVar7 == 0) goto LAB_0010b073;
        sVar7 = sVar7 - 1;
        pcVar2 = (this->super_Parser).s.s;
        local_78.size = (this->super_Parser).s.size;
        cVar1 = *pcVar3;
        (this->super_Parser).s.s = pcVar3 + 1;
        (this->super_Parser).s.size = sVar7;
        pcVar3 = pcVar3 + 1;
      } while (cVar1 != ')');
      (this->super_Parser).s.s = pcVar2;
      (this->super_Parser).s.size = local_78.size;
LAB_0010b073:
      local_58.size = (long)(this->super_Parser).s.s - (long)local_58.s;
      local_78.s = ")";
      local_78.size = StringView::strlen((StringView *)0x111d87,(char *)0x0);
      Parser::expect(&this->super_Parser,&local_78);
      cVar6 = std::
              _Rb_tree<StringView,_std::pair<const_StringView,_std::shared_ptr<PaintServer>_>,_std::_Select1st<std::pair<const_StringView,_std::shared_ptr<PaintServer>_>_>,_std::less<StringView>,_std::allocator<std::pair<const_StringView,_std::shared_ptr<PaintServer>_>_>_>
              ::find(&paint_servers->_M_t,&local_58);
      if ((_Rb_tree_header *)cVar6._M_node != &(paint_servers->_M_t)._M_impl.super__Rb_tree_header)
      {
        (paint->super___shared_ptr<PaintServer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)cVar6._M_node[1]._M_left;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(paint->super___shared_ptr<PaintServer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
                   ,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&cVar6._M_node[1]._M_right);
        return;
      }
      local_78.s = (char *)local_68;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,local_58.s,local_58.s + local_58.size);
      printf("url not found: %s\n",local_78.s);
      if ((long *)local_78.s == local_68) {
        return;
      }
      operator_delete(local_78.s,local_68[0] + 1);
      return;
    }
    CVar8 = parse_color(this);
    local_48 = CVar8._8_8_;
    local_38._8_4_ = extraout_XMM0_Dc;
    local_38._0_8_ = CVar8._0_8_;
    local_38._12_4_ = extraout_XMM0_Dd;
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
    p_Var5->_M_use_count = 1;
    p_Var5->_M_weak_count = 1;
    p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001166c0;
    p_Var5[1]._vptr__Sp_counted_base = (_func_int **)&PTR_get_paint_00116770;
    p_Var5[1]._M_use_count = local_38._0_4_;
    p_Var5[1]._M_weak_count = local_38._4_4_;
    *(int *)&p_Var5[2]._vptr__Sp_counted_base = (int)local_48;
    *(int *)((long)&p_Var5[2]._vptr__Sp_counted_base + 4) = (int)((ulong)local_48 >> 0x20);
    (paint->super___shared_ptr<PaintServer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)(p_Var5 + 1);
    this_00 = (paint->super___shared_ptr<PaintServer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
    ;
    (paint->super___shared_ptr<PaintServer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var5;
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    return;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  return;
}

Assistant:

void parse_paint(std::shared_ptr<PaintServer>& paint, const PaintServerMap& paint_servers) {
		if (parse("none")) {
			paint = nullptr;
		}
		else if (parse("inherit")) {

		}
		else if (parse("url")) {
			expect("(");
			expect("#");
			StringView start = get();
			parse_all([](Character c) {
				return c != ')';
			});
			StringView id = get() - start;
			expect(")");
			auto i = paint_servers.find(id);
			if (i == paint_servers.end()) {
				//error("invalid IRI: " + id.to_string());
				printf("url not found: %s\n", id.to_string().c_str());
			}
			else {
				paint = i->second;
			}
		}
		else {
			paint = std::make_shared<ColorPaintServer>(parse_color());
		}
	}